

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O0

void rcg::storePointCloud
               (string *name,double f,double t,double scale,shared_ptr<const_rcg::Image> *left,
               shared_ptr<const_rcg::Image> *disp,shared_ptr<const_rcg::Image> *conf,
               shared_ptr<const_rcg::Image> *error)

{
  value_type vVar1;
  bool bVar2;
  uint16_t uVar3;
  element_type *peVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  reference pvVar8;
  unsigned_short *puVar9;
  long lVar10;
  uint64_t uVar11;
  ostream *poVar12;
  void *pvVar13;
  __shared_ptr *in_RCX;
  string *in_RDI;
  uint8_t *puVar14;
  __shared_ptr *in_R8;
  double in_XMM0_Qa;
  double dVar15;
  shared_ptr<const_rcg::Image> *img;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double in_XMM1_Qa;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint8_t *in_XMM2_Qa;
  undefined1 auVar24 [16];
  uint32_t fc [4];
  int j_1;
  int jj_1;
  int valid_1;
  uint16_t vmax_1;
  uint16_t vmin_1;
  uint16_t v_1 [4];
  size_t i_3;
  size_t k_3;
  uint32_t *ips;
  uint8_t rgb [3];
  double size;
  double x2;
  double z;
  double y;
  double x;
  double d;
  size_t i_2;
  size_t k_2;
  ofstream out;
  double timestamp;
  ostringstream os;
  size_t estep;
  size_t cstep;
  uint8_t *eps;
  uint8_t *cps;
  int jj;
  int valid;
  uint16_t vmax;
  uint16_t vmin;
  uint16_t v [4];
  size_t i_1;
  size_t k_1;
  int tn;
  uint16_t vstep;
  size_t i;
  int j;
  size_t k;
  uint32_t n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vindex;
  uint32_t vinvalid;
  size_t vi;
  size_t dstep;
  uint8_t *dps;
  size_t ds;
  bool bigendian;
  size_t height;
  size_t width;
  ostream *in_stack_fffffffffffff850;
  size_type in_stack_fffffffffffff858;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff860;
  ostream *in_stack_fffffffffffff908;
  uint32_t k_00;
  ostream *in_stack_fffffffffffff910;
  uint8_t *rgb_00;
  uint local_548 [4];
  uint local_538;
  int local_534;
  int local_530;
  unsigned_short local_52c;
  unsigned_short local_52a;
  uint16_t local_528 [4];
  ulong local_520;
  ulong local_518;
  uint *local_510;
  byte local_503;
  byte local_502;
  byte local_501;
  double local_500;
  double local_4f8;
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  ulong local_4d0;
  ulong local_4c8;
  ostream local_4c0 [512];
  string local_2c0 [36];
  int local_29c;
  double local_298;
  ostringstream local_290 [376];
  long local_118;
  long local_110;
  uint8_t *local_108;
  uint8_t *local_100;
  int local_f4;
  int local_f0;
  unsigned_short local_ec;
  unsigned_short local_ea;
  uint16_t local_e8 [4];
  ulong local_e0;
  ulong local_d8;
  int local_d0;
  ushort local_ca;
  ulong local_c8;
  int local_bc;
  ulong local_b8;
  value_type local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  undefined4 local_7c;
  size_type local_78;
  long local_70;
  uint8_t *local_68;
  ulong local_60;
  byte local_51;
  size_t local_50;
  size_t local_48;
  uint8_t *local_20;
  double local_18;
  double local_10;
  undefined4 uVar23;
  undefined4 uVar25;
  
  local_20 = in_XMM2_Qa;
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  peVar4 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x17188a);
  local_48 = Image::getWidth(peVar4);
  peVar4 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1718a7);
  local_50 = Image::getHeight(peVar4);
  peVar4 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1718c4);
  local_51 = Image::isBigEndian(peVar4);
  peVar4 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1718e0);
  sVar5 = Image::getWidth(peVar4);
  peVar4 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1718fd);
  sVar6 = Image::getWidth(peVar4);
  peVar4 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x17192a);
  sVar7 = Image::getWidth(peVar4);
  local_60 = ((sVar5 - 1) + sVar6) / sVar7;
  auVar19._8_4_ = (int)(local_48 >> 0x20);
  auVar19._0_8_ = local_48;
  auVar19._12_4_ = 0x45300000;
  local_10 = local_10 *
             ((auVar19._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0));
  std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x171998);
  local_68 = Image::getPixels((Image *)0x1719a0);
  peVar4 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1719b5);
  sVar5 = Image::getWidth(peVar4);
  peVar4 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1719d2);
  sVar6 = Image::getXPadding(peVar4);
  local_70 = sVar6 + sVar5 * 2;
  local_78 = 0;
  local_7c = 0xffffffff;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x171a36);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,
             (allocator_type *)in_stack_fffffffffffff850);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x171a62);
  local_b0 = 0;
  for (local_b8 = 0; local_b8 < local_50; local_b8 = local_b8 + 1) {
    local_bc = 0;
    for (local_c8 = 0; local_c8 < local_48; local_c8 = local_c8 + 1) {
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_98,local_78);
      vVar1 = local_b0;
      *pvVar8 = 0xffffffff;
      if (local_68[local_bc] != '\0' || local_68[local_bc + 1] != '\0') {
        local_b0 = local_b0 + 1;
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_98,local_78);
        *pvVar8 = vVar1;
      }
      local_bc = local_bc + 2;
      local_78 = local_78 + 1;
    }
    local_68 = local_68 + local_70;
  }
  std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x171be5);
  local_68 = Image::getPixels((Image *)0x171bed);
  dVar15 = ceil(2.0 / (double)local_20);
  local_ca = (ushort)(int)dVar15;
  local_d0 = 0;
  for (local_d8 = 1; local_d8 < local_50; local_d8 = local_d8 + 1) {
    for (local_e0 = 1; local_e0 < local_48; local_e0 = local_e0 + 1) {
      local_e8[0] = anon_unknown_2::getUint16(local_68,(bool)(local_51 & 1),local_e0 - 1);
      local_e8[1] = anon_unknown_2::getUint16(local_68,(bool)(local_51 & 1),local_e0);
      local_e8[2] = anon_unknown_2::getUint16(local_68 + local_70,(bool)(local_51 & 1),local_e0 - 1)
      ;
      local_e8[3] = anon_unknown_2::getUint16(local_68 + local_70,(bool)(local_51 & 1),local_e0);
      local_ea = 0xffff;
      local_ec = 0;
      local_f0 = 0;
      for (local_f4 = 0; local_f4 < 4; local_f4 = local_f4 + 1) {
        if (local_e8[local_f4] != 0) {
          puVar9 = std::min<unsigned_short>(&local_ea,local_e8 + local_f4);
          local_ea = *puVar9;
          puVar9 = std::max<unsigned_short>(&local_ec,local_e8 + local_f4);
          local_ec = *puVar9;
          local_f0 = local_f0 + 1;
        }
      }
      if ((2 < local_f0) && ((int)((uint)local_ec - (uint)local_ea) <= (int)(uint)local_ca)) {
        local_d0 = local_f0 + -2 + local_d0;
      }
    }
    local_68 = local_68 + local_70;
  }
  std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x171f20);
  local_68 = Image::getPixels((Image *)0x171f28);
  local_100 = (uint8_t *)0x0;
  local_108 = (uint8_t *)0x0;
  local_110 = 0;
  local_118 = 0;
  bVar2 = std::__shared_ptr::operator_cast_to_bool(in_RCX);
  if (bVar2) {
    std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x171f95);
    local_100 = Image::getPixels((Image *)0x171f9d);
    peVar4 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x171fc4);
    sVar5 = Image::getWidth(peVar4);
    peVar4 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x171ff3);
    sVar6 = Image::getXPadding(peVar4);
    local_110 = sVar5 + sVar6;
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool(in_R8);
  if (bVar2) {
    std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x172043);
    local_108 = Image::getPixels((Image *)0x17204b);
    peVar4 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x172072);
    sVar5 = Image::getWidth(peVar4);
    peVar4 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1720a1);
    sVar6 = Image::getXPadding(peVar4);
    local_118 = sVar5 + sVar6;
  }
  lVar10 = std::__cxx11::string::size();
  if (lVar10 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_290);
    peVar4 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x172101);
    uVar11 = Image::getTimestampNS(peVar4);
    auVar16._8_4_ = (int)(uVar11 >> 0x20);
    auVar16._0_8_ = uVar11;
    auVar16._12_4_ = 0x45300000;
    local_298 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)) / 1000000000.0;
    poVar12 = std::operator<<((ostream *)local_290,"rc_visard_");
    local_29c = (int)std::setprecision(0x10);
    poVar12 = std::operator<<(poVar12,(_Setprecision)local_29c);
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_298);
    std::operator<<(poVar12,".ply");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(in_RDI,local_2c0);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::ostringstream::~ostringstream(local_290);
  }
  std::ofstream::ofstream(local_4c0,in_RDI,_S_out);
  poVar12 = std::operator<<(local_4c0,"ply");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<(local_4c0,"format ascii 1.0");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<(local_4c0,"comment Created with gc_pointcloud from Roboception GmbH");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<(local_4c0,"comment Camera [1 0 0; 0 1 0; 0 0 1] [0 0 0]");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<(local_4c0,"element vertex ");
  pvVar13 = (void *)std::ostream::operator<<(poVar12,local_b0);
  std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<(local_4c0,"property float32 x");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<(local_4c0,"property float32 y");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<(local_4c0,"property float32 z");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<(local_4c0,"property float32 scan_size");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  if (local_100 != (uint8_t *)0x0) {
    poVar12 = std::operator<<(local_4c0,"property float32 scan_conf");
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  }
  if (local_108 != (uint8_t *)0x0) {
    poVar12 = std::operator<<(local_4c0,"property float32 scan_error");
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  }
  poVar12 = std::operator<<(local_4c0,"property uint8 diffuse_red");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<(local_4c0,"property uint8 diffuse_green");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<(local_4c0,"property uint8 diffuse_blue");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<(local_4c0,"element face ");
  pvVar13 = (void *)std::ostream::operator<<(poVar12,local_d0);
  std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<(local_4c0,"property list uint8 uint32 vertex_indices");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<(local_4c0,"end_header");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  for (local_4c8 = 0; local_4c8 < local_50; local_4c8 = local_4c8 + 1) {
    for (local_4d0 = 0; local_4d0 < local_48; local_4d0 = local_4d0 + 1) {
      puVar14 = local_68;
      rgb_00 = local_20;
      uVar3 = anon_unknown_2::getUint16(local_68,(bool)(local_51 & 1),local_4d0);
      k_00 = (uint32_t)((ulong)in_stack_fffffffffffff908 >> 0x20);
      local_4d8 = (double)rgb_00 * (double)uVar3;
      if ((local_4d8 != 0.0) || (NAN(local_4d8))) {
        uVar25 = (undefined4)(local_4d0 >> 0x20);
        auVar24._8_4_ = uVar25;
        auVar24._0_8_ = local_4d0;
        auVar24._12_4_ = 0x45300000;
        uVar23 = (undefined4)(local_48 >> 0x20);
        auVar20._8_4_ = uVar23;
        auVar20._0_8_ = local_48;
        auVar20._12_4_ = 0x45300000;
        local_4e0 = ((((auVar20._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0)) * -0.5 +
                     (auVar24._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_4d0) - 4503599627370496.0) + 0.5) *
                    local_18) / local_4d8;
        auVar21._8_4_ = (int)(local_4c8 >> 0x20);
        auVar21._0_8_ = local_4c8;
        auVar21._12_4_ = 0x45300000;
        auVar17._8_4_ = (int)(local_50 >> 0x20);
        auVar17._0_8_ = local_50;
        auVar17._12_4_ = 0x45300000;
        local_4e8 = ((((auVar17._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0)) * -0.5 +
                     (auVar21._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_4c8) - 4503599627370496.0) + 0.5) *
                    local_18) / local_4d8;
        local_4f0 = (local_10 * local_18) / local_4d8;
        auVar22._8_4_ = uVar25;
        auVar22._0_8_ = local_4d0;
        auVar22._12_4_ = 0x45300000;
        auVar18._8_4_ = uVar23;
        auVar18._0_8_ = local_48;
        auVar18._12_4_ = 0x45300000;
        local_4f8 = ((((auVar18._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0)) * -0.5 +
                     (auVar22._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_4d0) - 4503599627370496.0)) * local_18)
                    / local_4d8;
        std::abs((int)puVar14);
        local_500 = (double)img * 2.8;
        getColor(rgb_00,img,(uint32_t)((ulong)in_stack_fffffffffffff910 >> 0x20),
                 (uint32_t)in_stack_fffffffffffff910,k_00);
        in_stack_fffffffffffff910 = (ostream *)std::ostream::operator<<(local_4c0,local_4e0);
        in_stack_fffffffffffff908 = std::operator<<(in_stack_fffffffffffff910," ");
        poVar12 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffff908,local_4e8);
        poVar12 = std::operator<<(poVar12," ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_4f0);
        poVar12 = std::operator<<(poVar12," ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_500);
        std::operator<<(poVar12," ");
        if (local_100 != (uint8_t *)0x0) {
          poVar12 = (ostream *)
                    std::ostream::operator<<(local_4c0,(double)local_100[local_4d0] / 255.0);
          std::operator<<(poVar12," ");
        }
        if (local_108 != (uint8_t *)0x0) {
          poVar12 = (ostream *)
                    std::ostream::operator<<
                              (local_4c0,
                               ((double)local_108[local_4d0] * (double)local_20 * local_10 *
                               local_18) / (local_4d8 * local_4d8));
          std::operator<<(poVar12," ");
        }
        poVar12 = (ostream *)std::ostream::operator<<(local_4c0,(uint)local_503);
        std::operator<<(poVar12," ");
        poVar12 = (ostream *)std::ostream::operator<<(local_4c0,(uint)local_502);
        std::operator<<(poVar12," ");
        pvVar13 = (void *)std::ostream::operator<<(local_4c0,(uint)local_501);
        std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
      }
    }
    local_68 = local_68 + local_70;
    local_100 = local_100 + local_110;
    local_108 = local_108 + local_118;
  }
  std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x172c11);
  local_68 = Image::getPixels((Image *)0x172c19);
  local_510 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x172c3a);
  for (local_518 = 1; local_518 < local_50; local_518 = local_518 + 1) {
    for (local_520 = 1; local_520 < local_48; local_520 = local_520 + 1) {
      local_528[0] = anon_unknown_2::getUint16(local_68,(bool)(local_51 & 1),local_520 - 1);
      local_528[1] = anon_unknown_2::getUint16(local_68,(bool)(local_51 & 1),local_520);
      local_528[2] = anon_unknown_2::getUint16
                               (local_68 + local_70,(bool)(local_51 & 1),local_520 - 1);
      local_528[3] = anon_unknown_2::getUint16(local_68 + local_70,(bool)(local_51 & 1),local_520);
      local_52a = 0xffff;
      local_52c = 0;
      local_530 = 0;
      for (local_534 = 0; local_534 < 4; local_534 = local_534 + 1) {
        if (local_528[local_534] != 0) {
          puVar9 = std::min<unsigned_short>(&local_52a,local_528 + local_534);
          local_52a = *puVar9;
          puVar9 = std::max<unsigned_short>(&local_52c,local_528 + local_534);
          local_52c = *puVar9;
          local_530 = local_530 + 1;
        }
      }
      if ((2 < local_530) && ((int)((uint)local_52c - (uint)local_52a) <= (int)(uint)local_ca)) {
        if (local_510[local_520 - 1] != 0xffffffff) {
          local_548[0] = local_510[local_520 - 1];
        }
        local_538 = (uint)(local_510[local_520 - 1] != 0xffffffff);
        if (local_510[local_48 + local_520 + -1] != 0xffffffff) {
          local_548[(int)local_538] = local_510[local_48 + local_520 + -1];
          local_538 = local_538 + 1;
        }
        if (local_510[local_48 + local_520] != 0xffffffff) {
          local_548[(int)local_538] = local_510[local_48 + local_520];
          local_538 = local_538 + 1;
        }
        if (local_510[local_520] != 0xffffffff) {
          local_548[(int)local_538] = local_510[local_520];
          local_538 = local_538 + 1;
        }
        poVar12 = std::operator<<(local_4c0,"3 ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_548[0]);
        poVar12 = std::operator<<(poVar12,' ');
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_548[1]);
        poVar12 = std::operator<<(poVar12,' ');
        pvVar13 = (void *)std::ostream::operator<<(poVar12,local_548[2]);
        std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
        if (local_538 == 4) {
          poVar12 = std::operator<<(local_4c0,"3 ");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_548[2]);
          in_stack_fffffffffffff850 = std::operator<<(poVar12,' ');
          poVar12 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffff850,local_548[3]);
          poVar12 = std::operator<<(poVar12,' ');
          pvVar13 = (void *)std::ostream::operator<<(poVar12,local_548[0]);
          std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    local_510 = local_510 + local_48;
    local_68 = local_68 + local_70;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_4c0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff850);
  return;
}

Assistant:

void storePointCloud(std::string name, double f, double t, double scale,
                     std::shared_ptr<const Image> left,
                     std::shared_ptr<const Image> disp,
                     std::shared_ptr<const Image> conf,
                     std::shared_ptr<const Image> error)
{
  // get size and scale factor between left image and disparity image

  size_t width=disp->getWidth();
  size_t height=disp->getHeight();
  bool bigendian=disp->isBigEndian();
  size_t ds=(left->getWidth()+disp->getWidth()-1)/disp->getWidth();

  // convert focal length factor into focal length in (disparity) pixels

  f*=width;

  // get pointer to disparity data and size of row in bytes

  const uint8_t *dps=disp->getPixels();
  size_t dstep=disp->getWidth()*sizeof(uint16_t)+disp->getXPadding();

  // count number of valid disparities and store vertice index in a temporary
  // index image

  size_t vi=0;
  const uint32_t vinvalid=0xffffffff;
  std::vector<uint32_t> vindex(width*height);

  uint32_t n=0;
  for (size_t k=0; k<height; k++)
  {
    int j=0;
    for (size_t i=0; i<width; i++)
    {
      vindex[vi]=vinvalid;
      if ((dps[j]|dps[j+1]) != 0) vindex[vi]=n++;

      j+=2;
      vi++;
    }

    dps+=dstep;
  }

  dps=disp->getPixels();

  // count number of triangles

  const uint16_t vstep=static_cast<uint16_t>(std::ceil(2/scale));

  int tn=0;
  for (size_t k=1; k<height; k++)
  {
    for (size_t i=1; i<width; i++)
    {
      uint16_t v[4];
      v[0]=getUint16(dps, bigendian, i-1);
      v[1]=getUint16(dps, bigendian, i);
      v[2]=getUint16(dps+dstep, bigendian, i-1);
      v[3]=getUint16(dps+dstep, bigendian, i);

      uint16_t vmin=65535;
      uint16_t vmax=0;
      int valid=0;

      for (int jj=0; jj<4; jj++)
      {
        if (v[jj])
        {
          vmin=std::min(vmin, v[jj]);
          vmax=std::max(vmax, v[jj]);
          valid++;
        }
      }

      if (valid >= 3 && vmax-vmin <= vstep)
      {
        tn+=valid-2;
      }
    }

    dps+=dstep;
  }

  dps=disp->getPixels();

  // get pointer to optional confidence and error data and size of row in bytes

  const uint8_t *cps=0, *eps=0;
  size_t cstep=0, estep=0;

  if (conf)
  {
    cps=conf->getPixels();
    cstep=conf->getWidth()*sizeof(uint8_t)+conf->getXPadding();
  }

  if (error)
  {
    eps=error->getPixels();
    estep=error->getWidth()*sizeof(uint8_t)+error->getXPadding();
  }

  // open output file and write ASCII PLY header

  if (name.size() == 0)
  {
    std::ostringstream os;
    double timestamp=left->getTimestampNS()/1000000000.0;
    os << "rc_visard_" << std::setprecision(16) << timestamp << ".ply";
    name=os.str();
  }

  std::ofstream out(name);

  out << "ply" << std::endl;
  out << "format ascii 1.0" << std::endl;
  out << "comment Created with gc_pointcloud from Roboception GmbH" << std::endl;
  out << "comment Camera [1 0 0; 0 1 0; 0 0 1] [0 0 0]" << std::endl;
  out << "element vertex " << n << std::endl;
  out << "property float32 x" << std::endl;
  out << "property float32 y" << std::endl;
  out << "property float32 z" << std::endl;
  out << "property float32 scan_size" << std::endl; // i.e. size of 3D point

  if (cps != 0)
  {
    out << "property float32 scan_conf" << std::endl; // optional confidence
  }

  if (eps != 0)
  {
    out << "property float32 scan_error" << std::endl; // optional error in 3D along line of sight
  }

  out << "property uint8 diffuse_red" << std::endl;
  out << "property uint8 diffuse_green" << std::endl;
  out << "property uint8 diffuse_blue" << std::endl;
  out << "element face " << tn << std::endl;
  out << "property list uint8 uint32 vertex_indices" << std::endl;
  out << "end_header" << std::endl;

  // create colored point cloud

  for (size_t k=0; k<height; k++)
  {
    for (size_t i=0; i<width; i++)
    {
      // convert disparity from fixed comma 16 bit integer into float value

      double d=scale*getUint16(dps, bigendian, i);

      // if disparity is valid and color can be obtained

      if (d)
      {
        // reconstruct 3D point from disparity value

        double x=(i+0.5-0.5*width)*t/d;
        double y=(k+0.5-0.5*height)*t/d;
        double z=f*t/d;

        // compute size of reconstructed point

        double x2=(i-0.5*width)*t/d;
        double size=2*1.4*std::abs(x2-x);

        // get corresponding color value

        uint8_t rgb[3];
        getColor(rgb, left, static_cast<uint32_t>(ds), static_cast<uint32_t>(i),
                 static_cast<uint32_t>(k));

        // store colored point, optionally with confidence and error

        out << x << " " << y << " " << z << " " << size << " ";

        if (cps != 0)
        {
          out << cps[i]/255.0 << " ";
        }

        if (eps != 0)
        {
          out << eps[i]*scale*f*t/(d*d) << " ";
        }

        out << static_cast<int>(rgb[0]) << " ";
        out << static_cast<int>(rgb[1]) << " ";
        out << static_cast<int>(rgb[2]) << std::endl;
      }
    }

    dps+=dstep;
    cps+=cstep;
    eps+=estep;
  }

  dps=disp->getPixels();

  // create triangles

  uint32_t *ips=vindex.data();
  for (size_t k=1; k<height; k++)
  {
    for (size_t i=1; i<width; i++)
    {
      uint16_t v[4];
      v[0]=getUint16(dps, bigendian, i-1);
      v[1]=getUint16(dps, bigendian, i);
      v[2]=getUint16(dps+dstep, bigendian, i-1);
      v[3]=getUint16(dps+dstep, bigendian, i);

      uint16_t vmin=65535;
      uint16_t vmax=0;
      int valid=0;

      for (int jj=0; jj<4; jj++)
      {
        if (v[jj])
        {
          vmin=std::min(vmin, v[jj]);
          vmax=std::max(vmax, v[jj]);
          valid++;
        }
      }

      if (valid >= 3 && vmax-vmin <= vstep)
      {
        int j=0;
        uint32_t fc[4];

        if (ips[i-1] != vinvalid)
        {
          fc[j++]=ips[i-1];
        }

        if (ips[width+i-1] != vinvalid)
        {
          fc[j++]=ips[width+i-1];
        }

        if (ips[width+i] != vinvalid)
        {
          fc[j++]=ips[width+i];
        }

        if (ips[i] != vinvalid)
        {
          fc[j++]=ips[i];
        }

        out << "3 " << fc[0] << ' ' << fc[1] << ' ' << fc[2] << std::endl;

        if (j == 4)
        {
          out << "3 " << fc[2] << ' ' << fc[3] << ' ' << fc[0] << std::endl;
        }
      }
    }

    ips+=width;
    dps+=dstep;
  }

  out.close();
}